

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylinderShape.cpp
# Opt level: O3

void __thiscall
cbtCylinderShape::calculateLocalInertia(cbtCylinderShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  
  uVar1 = *(ulong *)(this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats;
  fVar7 = (float)*(undefined8 *)
                  ((this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats + 2);
  fVar10 = fVar7;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  fVar5 = fVar10;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar6 = fVar5;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1;
  iVar2 = *(int *)&(this->super_cbtConvexInternalShape).field_0x44;
  auVar9 = ZEXT416((uint)(mass / 12.0));
  fVar4 = mass * 0.25;
  fVar10 = (float)uVar1 + fVar10;
  fVar8 = mass * 0.5;
  if (iVar2 == 2) {
    fVar6 = fVar6 + fVar7;
    fVar8 = fVar8 * fVar10 * fVar10;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar10 * fVar10)),auVar9,
                             ZEXT416((uint)(fVar6 * fVar6 * 4.0)));
    fVar7 = auVar3._0_4_;
    fVar10 = fVar7;
  }
  else {
    auVar3 = vmovshdup_avx(auVar3);
    fVar5 = auVar3._0_4_ + fVar5;
    if (iVar2 == 0) {
      fVar7 = fVar8 * fVar5 * fVar5;
      auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar5 * fVar5)),auVar9,
                               ZEXT416((uint)(fVar10 * fVar10 * 4.0)));
      fVar10 = auVar3._0_4_;
      fVar8 = auVar3._0_4_;
    }
    else {
      auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar10 * fVar10)),auVar9,
                               ZEXT416((uint)(fVar5 * fVar5 * 4.0)));
      fVar7 = auVar3._0_4_;
      fVar10 = fVar8 * fVar10 * fVar10;
      fVar8 = fVar7;
    }
  }
  inertia->m_floats[0] = fVar7;
  inertia->m_floats[1] = fVar10;
  inertia->m_floats[2] = fVar8;
  inertia->m_floats[3] = 0.0;
  return;
}

Assistant:

void cbtCylinderShape::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
//Until Bullet 2.77 a box approximation was used, so uncomment this if you need backwards compatibility
//#define USE_BOX_INERTIA_APPROXIMATION 1
#ifndef USE_BOX_INERTIA_APPROXIMATION

	/*
	cylinder is defined as following:
	*
	* - principle axis aligned along y by default, radius in x, z-value not used
	* - for cbtCylinderShapeX: principle axis aligned along x, radius in y direction, z-value not used
	* - for cbtCylinderShapeZ: principle axis aligned along z, radius in x direction, y-value not used
	*
	*/

	cbtScalar radius2;                                    // square of cylinder radius
	cbtScalar height2;                                    // square of cylinder height
	cbtVector3 halfExtents = getHalfExtentsWithMargin();  // get cylinder dimension
	cbtScalar div12 = mass / 12.f;
	cbtScalar div4 = mass / 4.f;
	cbtScalar div2 = mass / 2.f;
	int idxRadius, idxHeight;

	switch (m_upAxis)  // get indices of radius and height of cylinder
	{
		case 0:  // cylinder is aligned along x
			idxRadius = 1;
			idxHeight = 0;
			break;
		case 2:  // cylinder is aligned along z
			idxRadius = 0;
			idxHeight = 2;
			break;
		default:  // cylinder is aligned along y
			idxRadius = 0;
			idxHeight = 1;
	}

	// calculate squares
	radius2 = halfExtents[idxRadius] * halfExtents[idxRadius];
	height2 = cbtScalar(4.) * halfExtents[idxHeight] * halfExtents[idxHeight];

	// calculate tensor terms
	cbtScalar t1 = div12 * height2 + div4 * radius2;
	cbtScalar t2 = div2 * radius2;

	switch (m_upAxis)  // set diagonal elements of inertia tensor
	{
		case 0:  // cylinder is aligned along x
			inertia.setValue(t2, t1, t1);
			break;
		case 2:  // cylinder is aligned along z
			inertia.setValue(t1, t1, t2);
			break;
		default:  // cylinder is aligned along y
			inertia.setValue(t1, t2, t1);
	}
#else   //USE_BOX_INERTIA_APPROXIMATION
	//approximation of box shape
	cbtVector3 halfExtents = getHalfExtentsWithMargin();

	cbtScalar lx = cbtScalar(2.) * (halfExtents.x());
	cbtScalar ly = cbtScalar(2.) * (halfExtents.y());
	cbtScalar lz = cbtScalar(2.) * (halfExtents.z());

	inertia.setValue(mass / (cbtScalar(12.0)) * (ly * ly + lz * lz),
					 mass / (cbtScalar(12.0)) * (lx * lx + lz * lz),
					 mass / (cbtScalar(12.0)) * (lx * lx + ly * ly));
#endif  //USE_BOX_INERTIA_APPROXIMATION
}